

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

string * __thiscall
t_dart_generator::init_value_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_field *field)

{
  uint uVar1;
  int iVar2;
  t_typedef *this_00;
  
  if (field->req_ != T_OPTIONAL) {
    this_00 = (t_typedef *)field->type_;
    iVar2 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[9])(this_00);
    if ((char)iVar2 != '\0') {
      this_00 = (t_typedef *)t_typedef::get_type(this_00);
    }
    iVar2 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])(this_00);
    if ((char)iVar2 != '\0') {
      uVar1 = *(uint *)&this_00->type_;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      if (7 < (ulong)uVar1) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)0x0,
                 (ulong)(&DAT_00383fc0 + *(int *)(&DAT_00383fc0 + (ulong)uVar1 * 4)));
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::init_value(t_field* field) {
  // Do not initialize optional fields
  if (field->get_req() == t_field::T_OPTIONAL) {
    return "";
  }

  t_type* ttype = field->get_type();

  // Get the actual type for a typedef
  if (ttype->is_typedef()) {
    ttype = ((t_typedef*)ttype)->get_type();
  }

  // Only consider base types for default initialization
  if (!ttype->is_base_type()) {
    return "";
  }
  t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();

  // Initialize bools, ints, and doubles with sane defaults
  string result;
  switch (tbase) {
  case t_base_type::TYPE_BOOL:
    result = " = false";
    break;
  case t_base_type::TYPE_I8:
  case t_base_type::TYPE_I16:
  case t_base_type::TYPE_I32:
  case t_base_type::TYPE_I64:
    result = " = 0";
    break;
  case t_base_type::TYPE_DOUBLE:
    result = " = 0.0";
    break;
  case t_base_type::TYPE_VOID:
  case t_base_type::TYPE_STRING:
    result = "";
    break;
  }

  return result;
}